

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceMatrixDecomposition::unpackPrePairData
          (ForceMatrixDecomposition *this,InteractionData *idat,int atom1,int atom2)

{
  value_type vVar1;
  reference pvVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  
  if ((*(uint *)(in_RDI + 0x30) & 0x80) != 0) {
    vVar1 = *(value_type *)(in_RSI + 0x2c0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0xa8)
                        ,(long)in_EDX);
    *pvVar2 = vVar1;
    vVar1 = *(value_type *)(in_RSI + 0x2c8);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0xa8)
                        ,(long)in_ECX);
    *pvVar2 = vVar1;
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::unpackPrePairData(InteractionData& idat,
                                                   int atom1, int atom2) {
#ifdef IS_MPI

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      atomRowData.density[atom1] = idat.rho1;
      atomColData.density[atom2] = idat.rho2;
    }

#else

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      snap_->atomData.density[atom1] = idat.rho1;
      snap_->atomData.density[atom2] = idat.rho2;
    }

#endif
  }